

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basics.cpp
# Opt level: O1

void parallel_runs(uint w)

{
  code *pcVar1;
  double dVar2;
  pointer ptVar3;
  pointer ptVar4;
  size_type sVar5;
  char extraout_AL;
  bool bVar6;
  char extraout_AL_00;
  anon_class_40_5_6a14f4ba_for__M_head_impl *paVar7;
  ulong uVar8;
  anon_class_40_5_6a14f4ba_for__M_head_impl *paVar9;
  anon_class_40_5_6a14f4ba_for__M_head_impl *extraout_RDX;
  anon_class_40_5_6a14f4ba_for__M_head_impl *extraout_RDX_00;
  anon_class_40_5_6a14f4ba_for__M_head_impl *extraout_RDX_01;
  anon_class_40_5_6a14f4ba_for__M_head_impl *extraout_RDX_02;
  anon_class_40_5_6a14f4ba_for__M_head_impl *extraout_RDX_03;
  anon_class_40_5_6a14f4ba_for__M_head_impl *extraout_RDX_04;
  anon_class_40_5_6a14f4ba_for__M_head_impl *extraout_RDX_05;
  anon_class_40_5_6a14f4ba_for__M_head_impl *paVar10;
  thread *t;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  int iVar11;
  ulong uVar12;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar14;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  atomic<int> counter;
  atomic<unsigned_long> barrier;
  ResultBuilder DOCTEST_RB;
  anon_class_8_1_bc7188dc make_taskflow;
  vector<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
  taskflows;
  Executor executor;
  vector<std::thread,_std::allocator<std::thread>_> local_2c8;
  uint local_2a4;
  size_type local_2a0;
  uint local_294;
  undefined8 local_290;
  Result local_288;
  undefined1 local_268 [16];
  uint **local_258;
  __native_type *local_250;
  char *local_248;
  undefined2 local_240;
  anon_union_24_2_13149d16_for_String_2 local_238;
  anon_union_24_2_13149d16_for_String_2 aStack_220;
  bool local_208;
  char *local_200;
  char *local_1f8;
  uint *local_1f0;
  int local_1e4;
  vector<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
  local_1e0;
  shared_ptr<tf::WorkerInterface> local_1c8;
  shared_ptr<tf::WorkerInterface> local_1b8;
  Subcase local_1a0;
  ulong local_170;
  __native_type local_168 [2];
  unique_lock local_108 [48];
  undefined1 local_d8 [40];
  long local_b0;
  
  local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0 = &local_2a4;
  doctest::String::String((String *)&local_168[0].__data,"RunAndWait",10);
  doctest::detail::Subcase::Subcase
            (&local_1a0,(String *)&local_168[0].__data,
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_basics.cpp"
             ,0x328);
  if (((char)local_168[0]._23_1_ < '\0') && ((void *)local_168[0]._0_8_ != (void *)0x0)) {
    operator_delete__((void *)local_168[0]._0_8_);
  }
  if (local_1a0.m_entered == true) {
    local_1b8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1b8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    tf::Executor::Executor((Executor *)&local_168[0].__data,(ulong)w,&local_1b8);
    paVar10 = extraout_RDX;
    if (local_1b8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      paVar10 = extraout_RDX_00;
    }
    LOCK();
    local_2a4 = 0;
    UNLOCK();
    iVar11 = 0;
    local_294 = w;
    do {
      ptVar4 = local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar3 = local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_268._0_8_ = &local_1f0;
      local_268._8_8_ = local_168;
      if (local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        if ((long)local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar12 = (long)local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        uVar8 = uVar12 + (uVar12 == 0);
        local_2a0 = uVar8 + uVar12;
        if (0xffffffffffffffe < local_2a0) {
          local_2a0 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar8,uVar12)) {
          local_2a0 = 0xfffffffffffffff;
        }
        if (local_2a0 == 0) {
          paVar9 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)0x0;
        }
        else {
          paVar9 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)
                   __gnu_cxx::new_allocator<std::thread>::allocate
                             ((new_allocator<std::thread> *)&local_2c8,local_2a0,(void *)0x0);
          paVar10 = extraout_RDX_02;
        }
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,parallel_runs(unsigned_int)::__1>
                  ((allocator_type *)((id *)&paVar9->t + uVar12),(thread *)local_268,
                   (anon_class_16_2_65e19626_for__M_head_impl *)paVar10);
        sVar5 = local_2a0;
        paVar10 = paVar9;
        for (paVar7 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)ptVar3;
            paVar7 != (anon_class_40_5_6a14f4ba_for__M_head_impl *)ptVar4;
            paVar7 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)&paVar7->taskflows) {
          *(id *)paVar10 = (id)0x0;
          uVar13 = *(undefined4 *)&paVar7->field_0x4;
          paVar10->t = paVar7->t;
          *(undefined4 *)&paVar10->field_0x4 = uVar13;
          *(id *)paVar7 = (id)0x0;
          paVar10 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)&paVar10->taskflows;
        }
        if ((anon_class_40_5_6a14f4ba_for__M_head_impl *)ptVar3 !=
            (anon_class_40_5_6a14f4ba_for__M_head_impl *)0x0) {
          operator_delete(ptVar3,(long)local_2c8.
                                       super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)ptVar3);
        }
        local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)((id *)&paVar9->t + sVar5);
        local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)paVar9;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,parallel_runs(unsigned_int)::__1>
                  ((allocator_type *)
                   local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish,(thread *)local_268,
                   (anon_class_16_2_65e19626_for__M_head_impl *)paVar10);
        paVar9 = extraout_RDX_01;
        paVar10 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)
                  local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&paVar10->taskflows;
      ptVar3 = local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar11 = iVar11 + 1;
      paVar10 = paVar9;
      paVar9 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)
               local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      w = local_294;
    } while (iVar11 != 0x20);
    for (; paVar10 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)
                     local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                     .super__Vector_impl_data._M_start,
        paVar7 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)
                 local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish, local_294 = w,
        paVar9 != (anon_class_40_5_6a14f4ba_for__M_head_impl *)ptVar3;
        paVar9 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)&paVar9->taskflows) {
      std::thread::join();
      w = local_294;
    }
    for (; (anon_class_40_5_6a14f4ba_for__M_head_impl *)
           local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish != paVar10;
        paVar10 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)&paVar10->taskflows) {
      if ((native_handle_type)*(id *)paVar10 != 0) goto LAB_00121562;
      paVar7 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)
               local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    local_238.buf[0] = '\0';
    local_238.buf[0x17] = '\x17';
    aStack_220.buf[0] = '\0';
    aStack_220.buf[0x17] = '\x17';
    local_268._0_8_ = *(native_handle_type *)(doctest::detail::g_cs + 0x20);
    local_268._12_4_ = (undefined4)((ulong)local_268._8_8_ >> 0x20);
    local_268._8_4_ = 0xc;
    local_258 = (uint **)0x142612;
    local_250 = (__native_type *)CONCAT44(local_250._4_4_,0x338);
    local_248 = "counter.load() == 32*1024*2";
    local_240._0_1_ = true;
    local_240._1_1_ = false;
    local_208 = false;
    local_200 = "";
    local_1f8 = "";
    local_1e0.
    super__Vector_base<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)((ulong)local_2a4 | 0xc00000000);
    uVar8 = (ulong)local_290 >> 0x20;
    local_290 = CONCAT44((int)uVar8,0x10000);
    local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)paVar7;
    doctest::detail::Expression_lhs<int_const>::operator==
              (&local_288,(Expression_lhs<int_const> *)&local_1e0,(int *)&local_290);
    doctest::String::operator=((String *)&aStack_220.data,&local_288.m_decomp);
    local_240 = CONCAT11(local_240._1_1_,local_288.m_passed) ^ 1;
    uVar13 = extraout_XMM0_Da;
    uVar14 = extraout_XMM0_Db;
    if ((local_288.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_288.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_288.m_decomp.field_0.data.ptr);
      uVar13 = extraout_XMM0_Da_00;
      uVar14 = extraout_XMM0_Db_00;
    }
    dVar2 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)local_268,(double)CONCAT44(uVar14,uVar13));
    if (extraout_AL != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)(SUB84(dVar2,0));
      return;
    }
    if (local_240._0_1_ == true) {
      bVar6 = doctest::detail::checkIfShouldThrow(local_268._8_4_);
      if (bVar6) {
        doctest::detail::throwException();
      }
    }
    if ((aStack_220.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_220._1_7_,aStack_220.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_220._1_7_,aStack_220.buf[0]));
    }
    if ((local_238.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_238._1_7_,local_238.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_238._1_7_,local_238.buf[0]));
    }
    tf::Executor::~Executor((Executor *)&local_168[0].__data);
  }
  doctest::detail::Subcase::~Subcase(&local_1a0);
  doctest::String::String((String *)&local_168[0].__data,"RunAndWaitForAll",0x10);
  doctest::detail::Subcase::Subcase
            (&local_1a0,(String *)&local_168[0].__data,
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_basics.cpp"
             ,0x33c);
  if (((char)local_168[0]._23_1_ < '\0') && ((void *)local_168[0]._0_8_ != (void *)0x0)) {
    operator_delete__((void *)local_168[0]._0_8_);
  }
  if (local_1a0.m_entered == true) {
    local_1c8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1c8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    tf::Executor::Executor((Executor *)&local_168[0].__data,(ulong)w,&local_1c8);
    if (local_1c8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1c8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    LOCK();
    local_2a4 = 0;
    UNLOCK();
    std::
    vector<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
    ::vector(&local_1e0,0x20,(allocator_type *)local_268);
    local_290 = 0;
    iVar11 = 0;
    paVar10 = extraout_RDX_03;
    do {
      ptVar4 = local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar3 = local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_268._0_4_ = iVar11;
      local_268._8_8_ = &local_1e0;
      local_258 = &local_1f0;
      local_250 = local_168;
      local_248 = (char *)&local_290;
      if (local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        if ((long)local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar12 = (long)local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        uVar8 = uVar12 + (uVar12 == 0);
        local_2a0 = uVar8 + uVar12;
        if (0xffffffffffffffe < local_2a0) {
          local_2a0 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar8,uVar12)) {
          local_2a0 = 0xfffffffffffffff;
        }
        if (local_2a0 == 0) {
          paVar9 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)0x0;
        }
        else {
          paVar9 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)
                   __gnu_cxx::new_allocator<std::thread>::allocate
                             ((new_allocator<std::thread> *)&local_2c8,local_2a0,(void *)0x0);
          paVar10 = extraout_RDX_05;
        }
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,parallel_runs(unsigned_int)::__2>
                  ((allocator_type *)((id *)&paVar9->t + uVar12),(thread *)local_268,paVar10);
        sVar5 = local_2a0;
        paVar10 = paVar9;
        for (paVar7 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)ptVar3;
            paVar7 != (anon_class_40_5_6a14f4ba_for__M_head_impl *)ptVar4;
            paVar7 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)&paVar7->taskflows) {
          *(id *)paVar10 = (id)0x0;
          uVar13 = *(undefined4 *)&paVar7->field_0x4;
          paVar10->t = paVar7->t;
          *(undefined4 *)&paVar10->field_0x4 = uVar13;
          *(id *)paVar7 = (id)0x0;
          paVar10 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)&paVar10->taskflows;
        }
        if ((anon_class_40_5_6a14f4ba_for__M_head_impl *)ptVar3 !=
            (anon_class_40_5_6a14f4ba_for__M_head_impl *)0x0) {
          operator_delete(ptVar3,(long)local_2c8.
                                       super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)ptVar3);
        }
        local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)((id *)&paVar9->t + sVar5);
        local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)paVar9;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,parallel_runs(unsigned_int)::__2>
                  ((allocator_type *)
                   local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish,(thread *)local_268,paVar10);
        paVar9 = extraout_RDX_04;
        paVar10 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)
                  local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&paVar10->taskflows;
      iVar11 = iVar11 + 1;
      paVar10 = paVar9;
    } while (iVar11 != 0x20);
    do {
    } while (local_290 != 0x20);
    local_268._0_8_ = local_d8;
    local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_268);
    local_268[8] = 1;
    if (local_b0 != 0) {
      do {
        std::condition_variable::wait(local_108);
      } while (local_b0 != 0);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_268);
    local_238.buf[0] = '\0';
    local_238.buf[0x17] = '\x17';
    aStack_220.buf[0] = '\0';
    aStack_220.buf[0x17] = '\x17';
    local_268._0_8_ = *(native_handle_type *)(doctest::detail::g_cs + 0x20);
    local_268._8_4_ = 0xc;
    local_258 = (uint **)0x142612;
    local_250 = (__native_type *)CONCAT44(local_250._4_4_,0x34c);
    local_248 = "counter.load() == 32*1024*2";
    local_240._0_1_ = true;
    local_240._1_1_ = false;
    local_208 = false;
    local_200 = "";
    local_1f8 = "";
    local_170 = (ulong)local_2a4 | 0xc00000000;
    local_1e4 = 0x10000;
    doctest::detail::Expression_lhs<int_const>::operator==
              (&local_288,(Expression_lhs<int_const> *)&local_170,&local_1e4);
    doctest::String::operator=((String *)&aStack_220.data,&local_288.m_decomp);
    local_240 = CONCAT11(local_240._1_1_,local_288.m_passed) ^ 1;
    uVar13 = extraout_XMM0_Da_01;
    uVar14 = extraout_XMM0_Db_01;
    if ((local_288.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_288.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_288.m_decomp.field_0.data.ptr);
      uVar13 = extraout_XMM0_Da_02;
      uVar14 = extraout_XMM0_Db_02;
    }
    dVar2 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)local_268,(double)CONCAT44(uVar14,uVar13));
    if (extraout_AL_00 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)(SUB84(dVar2,0));
      return;
    }
    if (local_240._0_1_ == true) {
      bVar6 = doctest::detail::checkIfShouldThrow(local_268._8_4_);
      if (bVar6) {
        doctest::detail::throwException();
      }
    }
    if ((aStack_220.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_220._1_7_,aStack_220.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_220._1_7_,aStack_220.buf[0]));
    }
    paVar9 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)
             local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    paVar10 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)
              local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((local_238.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_238._1_7_,local_238.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_238._1_7_,local_238.buf[0]));
      paVar9 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)
               local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      paVar10 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)
                local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    for (; paVar9 != paVar10;
        paVar9 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)&paVar9->taskflows) {
      std::thread::join();
    }
    paVar10 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)
              local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        if ((native_handle_type)*(id *)paVar10 != 0) {
LAB_00121562:
          std::terminate();
        }
        paVar10 = (anon_class_40_5_6a14f4ba_for__M_head_impl *)&paVar10->taskflows;
      } while (paVar10 !=
               (anon_class_40_5_6a14f4ba_for__M_head_impl *)
               local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish);
      local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_2c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    std::
    vector<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
    ::~vector(&local_1e0);
    tf::Executor::~Executor((Executor *)&local_168[0].__data);
  }
  doctest::detail::Subcase::~Subcase(&local_1a0);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_2c8);
  return;
}

Assistant:

void parallel_runs(unsigned w) {

  std::atomic<int> counter;
  std::vector<std::thread> threads;

  auto make_taskflow = [&] (tf::Taskflow& tf) {
    for(int i=0; i<1024; i++) {
      auto A = tf.emplace([&] () {
        counter.fetch_add(1, std::memory_order_relaxed);
      });
      auto B = tf.emplace([&] () {
        counter.fetch_add(1, std::memory_order_relaxed);
      });
      A.precede(B);
    }
  };

  SUBCASE("RunAndWait") {
    tf::Executor executor(w);
    counter = 0;
    for(int t=0; t<32; t++) {
      threads.emplace_back([&] () {
        tf::Taskflow taskflow;
        make_taskflow(taskflow);
        executor.run(taskflow).wait();
      });
    }

    for(auto& t : threads) {
      t.join();
    }
    threads.clear();

    REQUIRE(counter.load() == 32*1024*2);

  }

  SUBCASE("RunAndWaitForAll") {
    tf::Executor executor(w);
    counter = 0;
    std::vector<std::unique_ptr<tf::Taskflow>> taskflows(32);
    std::atomic<size_t> barrier(0);
    for(int t=0; t<32; t++) {
      threads.emplace_back([&, t=t] () {
        taskflows[t] = std::make_unique<tf::Taskflow>();
        make_taskflow(*taskflows[t]);
        executor.run(*taskflows[t]);
        ++barrier;    // make sure all runs are issued
      });
    }

    while(barrier != 32);
    executor.wait_for_all();
    REQUIRE(counter.load() == 32*1024*2);

    for(auto& t : threads) {
      t.join();
    }
    threads.clear();
  }
}